

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O3

bool __thiscall glslang::HlslGrammar::acceptStructBufferType(HlslGrammar *this,TType *type)

{
  bool bVar1;
  EHlslTokenClass EVar2;
  int iVar3;
  TPoolAllocator *pTVar4;
  TType *this_00;
  TArraySizes *this_01;
  undefined4 extraout_var;
  vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *this_02;
  undefined4 extraout_var_00;
  char *pcVar5;
  HlslParseContext *pHVar6;
  _func_int **pp_Var7;
  ulong uVar8;
  ulong uVar9;
  TType blockType;
  TTypeLoc member;
  TString local_110;
  undefined1 local_e8 [16];
  char *local_d8;
  ulong local_d0 [16];
  TTypeLoc local_50;
  
  EVar2 = HlslTokenStream::peek(&this->super_HlslTokenStream);
  uVar9 = 0;
  bVar1 = true;
  switch(EVar2) {
  case EHTokAppendStructuredBuffer:
  case EHTokConsumeStructuredBuffer:
    uVar8 = 0x4b06;
    break;
  case EHTokByteAddressBuffer:
    uVar8 = 0x4c86;
    uVar9 = 0x800000000000;
    goto LAB_003a3025;
  case EHTokRWByteAddressBuffer:
    uVar8 = 0x4d06;
    uVar9 = 0;
LAB_003a3025:
    bVar1 = false;
    break;
  case EHTokRWStructuredBuffer:
    uVar8 = 0x4b86;
    uVar9 = 0;
    break;
  case EHTokStructuredBuffer:
    uVar8 = 0x4c06;
    uVar9 = 0x800000000000;
    break;
  default:
    goto switchD_003a3000_default;
  }
  HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  pTVar4 = GetThreadPoolAllocator();
  this_00 = (TType *)TPoolAllocator::allocate(pTVar4,0x98);
  TType::TType(this_00,EbtVoid,EvqTemporary,1,0,0,false);
  if (bVar1) {
    bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftAngle);
    if (bVar1) {
      local_e8._0_8_ = (TIntermNode *)0x0;
      bVar1 = acceptType(this,this_00,(TIntermNode **)local_e8);
      if (bVar1) {
        bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightAngle);
        if (bVar1) goto LAB_003a3129;
        pHVar6 = this->parseContext;
        pp_Var7 = (pHVar6->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar5 = "right angle bracket";
      }
      else {
        pHVar6 = this->parseContext;
        pp_Var7 = (pHVar6->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar5 = "type";
      }
    }
    else {
      pHVar6 = this->parseContext;
      pp_Var7 = (pHVar6->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar5 = "left angle bracket";
    }
    uVar9 = 0;
    (*pp_Var7[0x2d])(pHVar6,&(this->super_HlslTokenStream).token,"Expected",pcVar5,"");
  }
  else {
    TType::TType((TType *)local_e8,EbtUint,EvqBuffer,1,0,0,false);
    TType::shallowCopy(this_00,(TType *)local_e8);
LAB_003a3129:
    pTVar4 = GetThreadPoolAllocator();
    this_01 = (TArraySizes *)TPoolAllocator::allocate(pTVar4,0x18);
    (this_01->sizes)._vptr_TSmallArrayVector = (_func_int **)&PTR__TSmallArrayVector_009237c8;
    (this_01->sizes).sizes = (TVector<glslang::TArraySize> *)0x0;
    this_01->implicitArraySize = 0;
    this_01->implicitlySized = true;
    this_01->variablyIndexed = false;
    TSmallArrayVector::push_back((TSmallArrayVector *)this_01,0,(TIntermTyped *)0x0);
    this_00->arraySizes = this_01;
    iVar3 = (*this_00->_vptr_TType[10])(this_00);
    *(ulong *)(CONCAT44(extraout_var,iVar3) + 8) =
         *(ulong *)(CONCAT44(extraout_var,iVar3) + 8) & 0xffffffffffffff80 | 6;
    local_e8._0_8_ = GetThreadPoolAllocator();
    local_e8._8_8_ = local_d0;
    local_d0[0] = CONCAT26(local_d0[0]._6_2_,0x6174616440);
    local_d8 = (char *)0x5;
    (*this_00->_vptr_TType[4])(this_00,local_e8);
    pTVar4 = GetThreadPoolAllocator();
    this_02 = (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)
              TPoolAllocator::allocate(pTVar4,0x20);
    *(undefined8 *)this_02 = 0;
    *(undefined8 *)(this_02 + 8) = 0;
    *(undefined8 *)(this_02 + 0x10) = 0;
    *(undefined8 *)(this_02 + 0x18) = 0;
    pTVar4 = GetThreadPoolAllocator();
    *(TPoolAllocator **)this_02 = pTVar4;
    *(undefined8 *)(this_02 + 8) = 0;
    *(undefined8 *)(this_02 + 0x10) = 0;
    *(undefined8 *)(this_02 + 0x18) = 0;
    local_50.loc.name = (this->super_HlslTokenStream).token.loc.name;
    local_50.loc.string = (this->super_HlslTokenStream).token.loc.string;
    local_50.loc.line = (this->super_HlslTokenStream).token.loc.line;
    local_50.loc.column = (this->super_HlslTokenStream).token.loc.column;
    local_50.loc._20_4_ = *(undefined4 *)&(this->super_HlslTokenStream).token.loc.field_0x14;
    local_50.type = this_00;
    std::vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>>::
    _M_realloc_insert<glslang::TTypeLoc_const&>(this_02,(iterator)0x0,&local_50);
    local_110._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    local_110._M_string_length = 0;
    local_110.field_2._M_local_buf[0] = '\0';
    iVar3 = (*this_00->_vptr_TType[10])(this_00);
    TType::TType((TType *)local_e8,(TTypeList *)this_02,&local_110,
                 (TQualifier *)CONCAT44(extraout_var_00,iVar3));
    local_d0[0] = uVar9 | uVar8 | local_d0[0] & 0xffff7fffffff0000;
    HlslParseContext::shareStructBufferType(this->parseContext,(TType *)local_e8);
    TType::shallowCopy(type,(TType *)local_e8);
    uVar9 = 1;
  }
switchD_003a3000_default:
  return SUB81(uVar9,0);
}

Assistant:

bool HlslGrammar::acceptStructBufferType(TType& type)
{
    const EHlslTokenClass structBuffType = peek();

    // TODO: globallycoherent
    bool hasTemplateType = true;
    bool readonly = false;

    TStorageQualifier storage = EvqBuffer;
    TBuiltInVariable  builtinType = EbvNone;

    switch (structBuffType) {
    case EHTokAppendStructuredBuffer:
        builtinType = EbvAppendConsume;
        break;
    case EHTokByteAddressBuffer:
        hasTemplateType = false;
        readonly = true;
        builtinType = EbvByteAddressBuffer;
        break;
    case EHTokConsumeStructuredBuffer:
        builtinType = EbvAppendConsume;
        break;
    case EHTokRWByteAddressBuffer:
        hasTemplateType = false;
        builtinType = EbvRWByteAddressBuffer;
        break;
    case EHTokRWStructuredBuffer:
        builtinType = EbvRWStructuredBuffer;
        break;
    case EHTokStructuredBuffer:
        builtinType = EbvStructuredBuffer;
        readonly = true;
        break;
    default:
        return false;  // not a structure buffer type
    }

    advanceToken();  // consume the structure keyword

    // type on which this StructedBuffer is templatized.  E.g, StructedBuffer<MyStruct> ==> MyStruct
    TType* templateType = new TType;

    if (hasTemplateType) {
        if (! acceptTokenClass(EHTokLeftAngle)) {
            expected("left angle bracket");
            return false;
        }
    
        if (! acceptType(*templateType)) {
            expected("type");
            return false;
        }
        if (! acceptTokenClass(EHTokRightAngle)) {
            expected("right angle bracket");
            return false;
        }
    } else {
        // byte address buffers have no explicit type.
        TType uintType(EbtUint, storage);
        templateType->shallowCopy(uintType);
    }

    // Create an unsized array out of that type.
    // TODO: does this work if it's already an array type?
    TArraySizes* unsizedArray = new TArraySizes;
    unsizedArray->addInnerSize(UnsizedArraySize);
    templateType->transferArraySizes(unsizedArray);
    templateType->getQualifier().storage = storage;

    // field name is canonical for all structbuffers
    templateType->setFieldName("@data");

    TTypeList* blockStruct = new TTypeList;
    TTypeLoc  member = { templateType, token.loc };
    blockStruct->push_back(member);

    // This is the type of the buffer block (SSBO)
    TType blockType(blockStruct, "", templateType->getQualifier());

    blockType.getQualifier().storage = storage;
    blockType.getQualifier().readonly = readonly;
    blockType.getQualifier().builtIn = builtinType;

    // We may have created an equivalent type before, in which case we should use its
    // deep structure.
    parseContext.shareStructBufferType(blockType);

    type.shallowCopy(blockType);

    return true;
}